

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase290::run(TestCase290 *this)

{
  uint uVar1;
  bool bVar2;
  Bounded<255UL,_unsigned_char> BVar3;
  Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char> QVar4;
  Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char> end;
  Bounded<255UL,_unsigned_int> bounded;
  SafeUnwrapper<255UL,_unsigned_int> b;
  bool local_c2;
  bool local_c1;
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  Quantity<kj::Bounded<255ul,unsigned_char>,unsigned_char> local_b5;
  Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char> local_b4;
  Iterator IStack_b0;
  Quantity<kj::Bounded<255UL,_unsigned_char>,_unsigned_char> value_2;
  Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char> i_2;
  Iterator __end2_2;
  Iterator __begin2_2;
  Range<unsigned_int> local_98;
  Range<unsigned_int> *local_90;
  Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_> *__range2_2;
  uint local_80;
  bool _kj_shouldLog_3;
  SafeUnwrapper<255UL,_unsigned_int> SStack_7c;
  bool _kj_shouldLog_2;
  Quantity<kj::Bounded<255ul,unsigned_char>,unsigned_char> local_75;
  Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char> local_74;
  Iterator IStack_70;
  Quantity<kj::Bounded<255UL,_unsigned_char>,_unsigned_char> value_1;
  Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char> i_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  Range<unsigned_int> local_60;
  Range<unsigned_int> *local_58;
  Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_> *__range2_1;
  uint local_48;
  bool _kj_shouldLog_1;
  SafeUnwrapper<10UL,_unsigned_int> SStack_44;
  bool _kj_shouldLog;
  Quantity<kj::Bounded<10ul,unsigned_char>,unsigned_char> local_3d;
  Quantity<kj::Bounded<10UL,_unsigned_int>,_unsigned_char> local_3c;
  Iterator IStack_38;
  Quantity<kj::Bounded<10UL,_unsigned_char>,_unsigned_char> value;
  Quantity<kj::Bounded<10UL,_unsigned_int>,_unsigned_char> i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_int> local_28;
  Range<unsigned_int> *local_20;
  Range<kj::Quantity<kj::Bounded<10UL,_unsigned_int>,_unsigned_char>_> *__range2;
  uint expected;
  Quantity<kj::BoundedConst<1U>,_unsigned_char> BYTES;
  TestCase290 *this_local;
  
  __range2._7_1_ = 0;
  __range2._0_4_ = 0;
  _expected = this;
  bounded<10u>();
  operator*<kj::BoundedConst<10U>,_kj::BoundedConst<1U>,_unsigned_char>();
  local_28 = (Range<unsigned_int>)zeroTo<10u,unsigned_char>();
  local_20 = &local_28;
  i.value.value =
       (Bounded<10UL,_unsigned_int>)
       Range<kj::Quantity<kj::Bounded<10UL,_unsigned_int>,_unsigned_char>_>::begin
                 ((Range<kj::Quantity<kj::Bounded<10UL,_unsigned_int>,_unsigned_char>_> *)local_20);
  IStack_38 = Range<kj::Quantity<kj::Bounded<10UL,_unsigned_int>,_unsigned_char>_>::end
                        ((Range<kj::Quantity<kj::Bounded<10UL,_unsigned_int>,_unsigned_char>_> *)
                         local_20);
  while (bVar2 = Range<kj::Quantity<kj::Bounded<10UL,_unsigned_int>,_unsigned_char>_>::Iterator::
                 operator!=((Iterator *)&i,&stack0xffffffffffffffc8), bVar2) {
    local_3c = Range<kj::Quantity<kj::Bounded<10UL,_unsigned_int>,_unsigned_char>_>::Iterator::
               operator*((Iterator *)&i);
    Quantity<kj::Bounded<10ul,unsigned_char>,unsigned_char>::
    Quantity<kj::Bounded<10ul,unsigned_int>>(&local_3d,&local_3c);
    local_48 = (uint)Quantity<kj::Bounded<10ul,unsigned_char>,unsigned_char>::operator/
                               (&local_3d,
                                (Quantity<kj::BoundedConst<1U>,_unsigned_char> *)
                                ((long)&__range2 + 7));
    SStack_44 = unbound<10ul,unsigned_int>((Bounded<10UL,_unsigned_int>)local_48);
    uVar1 = (uint)__range2;
    __range2._0_4_ = (uint)__range2 + 1;
    bVar2 = kj::operator==(SStack_44,uVar1);
    if (!bVar2) {
      __range2_1._7_1_ = _::Debug::shouldLog(ERROR);
      while ((bool)__range2_1._7_1_ != false) {
        _::Debug::log<char_const(&)[54]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                   ,0x128,ERROR,"\"failed: expected \" \"unbound(value / BYTES) == expected++\"",
                   (char (*) [54])"failed: expected unbound(value / BYTES) == expected++");
        __range2_1._7_1_ = false;
      }
    }
    Range<kj::Quantity<kj::Bounded<10UL,_unsigned_int>,_unsigned_char>_>::Iterator::operator++
              ((Iterator *)&i);
  }
  if ((uint)__range2 != 10) {
    __range2_1._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)__range2_1._6_1_ != false) {
      _::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x12a,ERROR,"\"failed: expected \" \"expected == 10\"",
                 (char (*) [32])"failed: expected expected == 10");
      __range2_1._6_1_ = false;
    }
  }
  __range2._0_4_ = 0;
  BVar3 = bounded<unsigned_char>('\n');
  QVar4 = operator*<kj::Bounded<255UL,_unsigned_char>,_kj::BoundedConst<1U>,_unsigned_char>
                    (BVar3.value);
  local_60 = (Range<unsigned_int>)
             zeroTo<kj::Quantity<kj::Bounded<255ul,unsigned_int>,unsigned_char>>(QVar4);
  local_58 = &local_60;
  i_1.value.value =
       (Bounded<255UL,_unsigned_int>)
       Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_>::begin
                 ((Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_> *)local_58)
  ;
  IStack_70 = Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_>::end
                        ((Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_> *)
                         local_58);
  while (bVar2 = Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_>::Iterator::
                 operator!=((Iterator *)&i_1,&stack0xffffffffffffff90), bVar2) {
    local_74 = Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_>::Iterator::
               operator*((Iterator *)&i_1);
    Quantity<kj::Bounded<255ul,unsigned_char>,unsigned_char>::
    Quantity<kj::Bounded<255ul,unsigned_int>>(&local_75,&local_74);
    local_80 = (uint)Quantity<kj::Bounded<255ul,unsigned_char>,unsigned_char>::operator/
                               (&local_75,
                                (Quantity<kj::BoundedConst<1U>,_unsigned_char> *)
                                ((long)&__range2 + 7));
    SStack_7c = unbound<255ul,unsigned_int>((Bounded<255UL,_unsigned_int>)local_80);
    uVar1 = (uint)__range2;
    __range2._0_4_ = (uint)__range2 + 1;
    bVar2 = kj::operator==(SStack_7c,uVar1);
    if (!bVar2) {
      __range2_2._7_1_ = _::Debug::shouldLog(ERROR);
      while ((bool)__range2_2._7_1_ != false) {
        _::Debug::log<char_const(&)[54]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                   ,0x12f,ERROR,"\"failed: expected \" \"unbound(value / BYTES) == expected++\"",
                   (char (*) [54])"failed: expected unbound(value / BYTES) == expected++");
        __range2_2._7_1_ = false;
      }
    }
    Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_>::Iterator::operator++
              ((Iterator *)&i_1);
  }
  if ((uint)__range2 != 10) {
    __range2_2._6_1_ = _::Debug::shouldLog(ERROR);
    while ((bool)__range2_2._6_1_ != false) {
      _::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x131,ERROR,"\"failed: expected \" \"expected == 10\"",
                 (char (*) [32])"failed: expected expected == 10");
      __range2_2._6_1_ = false;
    }
  }
  __range2._0_4_ = 3;
  BVar3 = bounded<unsigned_char>('\x03');
  QVar4 = operator*<kj::Bounded<255UL,_unsigned_char>,_kj::BoundedConst<1U>,_unsigned_char>
                    (BVar3.value);
  BVar3 = bounded<unsigned_char>('\n');
  end = operator*<kj::Bounded<255UL,_unsigned_char>,_kj::BoundedConst<1U>,_unsigned_char>
                  (BVar3.value);
  local_98 = (Range<unsigned_int>)
             range<kj::Quantity<kj::Bounded<255ul,unsigned_int>,unsigned_char>>(QVar4,end);
  local_90 = &local_98;
  i_2.value.value =
       (Bounded<255UL,_unsigned_int>)
       Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_>::begin
                 ((Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_> *)local_90)
  ;
  IStack_b0 = Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_>::end
                        ((Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_> *)
                         local_90);
  while (bVar2 = Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_>::Iterator::
                 operator!=((Iterator *)&i_2,&stack0xffffffffffffff50), bVar2) {
    local_b4 = Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_>::Iterator::
               operator*((Iterator *)&i_2);
    Quantity<kj::Bounded<255ul,unsigned_char>,unsigned_char>::
    Quantity<kj::Bounded<255ul,unsigned_int>>(&local_b5,&local_b4);
    bounded = Quantity<kj::Bounded<255ul,unsigned_char>,unsigned_char>::operator/
                        (&local_b5,
                         (Quantity<kj::BoundedConst<1U>,_unsigned_char> *)((long)&__range2 + 7));
    b = unbound<255ul,unsigned_int>(bounded);
    uVar1 = (uint)__range2;
    __range2._0_4_ = (uint)__range2 + 1;
    bVar2 = kj::operator==(b,uVar1);
    if (!bVar2) {
      local_c1 = _::Debug::shouldLog(ERROR);
      while (local_c1 != false) {
        _::Debug::log<char_const(&)[54]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                   ,0x136,ERROR,"\"failed: expected \" \"unbound(value / BYTES) == expected++\"",
                   (char (*) [54])"failed: expected unbound(value / BYTES) == expected++");
        local_c1 = false;
      }
    }
    Range<kj::Quantity<kj::Bounded<255UL,_unsigned_int>,_unsigned_char>_>::Iterator::operator++
              ((Iterator *)&i_2);
  }
  if ((uint)__range2 != 10) {
    local_c2 = _::Debug::shouldLog(ERROR);
    while (local_c2 != false) {
      _::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x138,ERROR,"\"failed: expected \" \"expected == 10\"",
                 (char (*) [32])"failed: expected expected == 10");
      local_c2 = false;
    }
  }
  return;
}

Assistant:

TEST(UnitMeasure, BoundedQuantity) {
  auto BYTES = unit<Quantity<Bounded<12345, uint16_t>, byte>>();

  uint expected = 0;
  for (auto i: zeroTo(bounded<10>() * BYTES)) {
    Quantity<Bounded<10, uint8_t>, byte> value = i;
    KJ_EXPECT(unbound(value / BYTES) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 0;
  for (auto i: zeroTo(bounded((uint8_t)10) * BYTES)) {
    Quantity<Bounded<255, uint8_t>, byte> value = i;
    KJ_EXPECT(unbound(value / BYTES) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 3;
  for (auto i: range(bounded((uint8_t)3) * BYTES, bounded((uint8_t)10) * BYTES)) {
    Quantity<Bounded<255, uint8_t>, byte> value = i;
    KJ_EXPECT(unbound(value / BYTES) == expected++);
  }
  KJ_EXPECT(expected == 10);
}